

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newRhs,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldRhs)

{
  uint *puVar1;
  uint *puVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  Status *pSVar5;
  pointer pnVar6;
  pointer pnVar7;
  Real RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  Status SVar18;
  int iVar19;
  fpclass_type fVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  undefined8 *puVar22;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currLhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  undefined8 local_408;
  long lStack_400;
  uint local_3f8 [11];
  undefined3 uStack_3cb;
  int iStack_3c8;
  byte bStack_3c4;
  undefined8 local_3c0;
  cpp_dec_float<100U,_int,_void> local_3b8;
  cpp_dec_float<100U,_int,_void> local_368;
  cpp_dec_float<100U,_int,_void> local_318;
  double local_2c8;
  undefined8 uStack_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  pSVar5 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar6 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_368.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[i].m_backend.data;
  local_368.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
  local_368.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_368.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x20);
  local_368.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_368.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x30);
  local_368.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_368.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  iVar17 = pnVar6[i].m_backend.exp;
  bVar16 = pnVar6[i].m_backend.neg;
  fVar3 = pnVar6[i].m_backend.fpclass;
  iVar4 = pnVar6[i].m_backend.prec_elem;
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x10;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  lStack_400 = 0;
  local_3f8[0] = 0;
  local_3f8[1] = 0;
  local_3f8[2] = 0;
  local_3f8[3] = 0;
  local_3f8[4] = 0;
  local_3f8[5] = 0;
  local_3f8[6] = 0;
  local_3f8[7] = 0;
  local_3f8[8] = 0;
  local_3f8[9] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  bStack_3c4 = 0;
  local_368.exp = iVar17;
  local_368.neg = bVar16;
  local_368.fpclass = fVar3;
  local_368.prec_elem = iVar4;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_408,0.0);
  switch(pSVar5[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if ((this->theRep == ROW) && ((this->theShift).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_3b8.fpclass = cpp_dec_float_finite;
      local_3b8.prec_elem = 0x10;
      local_3b8.data._M_elems[0] = 0;
      local_3b8.data._M_elems[1] = 0;
      local_3b8.data._M_elems[2] = 0;
      local_3b8.data._M_elems[3] = 0;
      local_3b8.data._M_elems[4] = 0;
      local_3b8.data._M_elems[5] = 0;
      local_3b8.data._M_elems[6] = 0;
      local_3b8.data._M_elems[7] = 0;
      local_3b8.data._M_elems[8] = 0;
      local_3b8.data._M_elems[9] = 0;
      local_3b8.data._M_elems[10] = 0;
      local_3b8.data._M_elems[0xb] = 0;
      local_3b8.data._M_elems[0xc] = 0;
      local_3b8.data._M_elems[0xd] = 0;
      local_3b8.data._M_elems._56_5_ = 0;
      local_3b8.data._M_elems[0xf]._1_3_ = 0;
      local_3b8.exp = 0;
      local_3b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_3b8,0.0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->theShift).m_backend,&local_3b8);
      if (0 < iVar17) {
        pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        uVar9 = *(undefined8 *)((pcVar21->data)._M_elems + 2);
        uVar10 = *(undefined8 *)((pcVar21->data)._M_elems + 4);
        uVar11 = *(undefined8 *)((pcVar21->data)._M_elems + 6);
        uVar12 = *(undefined8 *)((pcVar21->data)._M_elems + 8);
        uVar13 = *(undefined8 *)((pcVar21->data)._M_elems + 10);
        uVar14 = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
        uVar15 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
        *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
             *(undefined8 *)(pcVar21->data)._M_elems;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar9;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar10;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar11;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) = uVar12;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10) = uVar13;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc) = uVar14;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe) = uVar15;
        (this->m_nonbasicValue).m_backend.exp = pcVar21->exp;
        (this->m_nonbasicValue).m_backend.neg = pcVar21->neg;
        iVar4 = pcVar21->prec_elem;
        (this->m_nonbasicValue).m_backend.fpclass = pcVar21->fpclass;
        (this->m_nonbasicValue).m_backend.prec_elem = iVar4;
        this->m_nonbasicValueUpToDate = false;
      }
    }
    SVar18 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,i);
    pSVar5[i] = SVar18;
    break;
  case P_FIXED:
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2)
    ;
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
    local_1c8.m_backend.exp = (newRhs->m_backend).exp;
    local_1c8.m_backend.neg = (newRhs->m_backend).neg;
    local_1c8.m_backend.fpclass = (newRhs->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
    local_218.m_backend.data._M_elems[0] = local_368.data._M_elems[0];
    local_218.m_backend.data._M_elems[1] = local_368.data._M_elems[1];
    local_218.m_backend.data._M_elems[2] = local_368.data._M_elems[2];
    local_218.m_backend.data._M_elems[3] = local_368.data._M_elems[3];
    local_218.m_backend.data._M_elems[4] = local_368.data._M_elems[4];
    local_218.m_backend.data._M_elems[5] = local_368.data._M_elems[5];
    local_218.m_backend.data._M_elems[6] = local_368.data._M_elems[6];
    local_218.m_backend.data._M_elems[7] = local_368.data._M_elems[7];
    local_218.m_backend.data._M_elems[8] = local_368.data._M_elems[8];
    local_218.m_backend.data._M_elems[9] = local_368.data._M_elems[9];
    local_218.m_backend.data._M_elems[10] = local_368.data._M_elems[10];
    local_218.m_backend.data._M_elems[0xb] = local_368.data._M_elems[0xb];
    local_218.m_backend.data._M_elems[0xc] = local_368.data._M_elems[0xc];
    local_218.m_backend.data._M_elems[0xd] = local_368.data._M_elems[0xd];
    local_218.m_backend.data._M_elems[0xe] = local_368.data._M_elems[0xe];
    local_218.m_backend.data._M_elems[0xf] = local_368.data._M_elems[0xf];
    local_218.m_backend.exp = iVar17;
    local_218.m_backend.neg = bVar16;
    local_218.m_backend.fpclass = fVar3;
    local_218.m_backend.prec_elem = iVar4;
    RVar8 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar16 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_1c8,&local_218,RVar8);
    if ((bVar16) && (pSVar5[i] = P_ON_LOWER, this->initialized == true)) {
      pnVar6 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar7 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = *(undefined8 *)&pnVar6[i].m_backend.data;
      uVar10 = *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x30);
      uVar15 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar7[i].m_backend.data + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar1 = (uint *)((long)&pnVar7[i].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar13;
      *(undefined8 *)(puVar1 + 2) = uVar14;
      puVar1 = (uint *)((long)&pnVar7[i].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar11;
      *(undefined8 *)(puVar1 + 2) = uVar12;
      *(undefined8 *)&pnVar7[i].m_backend.data = uVar9;
      *(undefined8 *)((long)&pnVar7[i].m_backend.data + 8) = uVar10;
      pnVar7[i].m_backend.exp = pnVar6[i].m_backend.exp;
      pnVar7[i].m_backend.neg = pnVar6[i].m_backend.neg;
      iVar4 = pnVar6[i].m_backend.prec_elem;
      pnVar7[i].m_backend.fpclass = pnVar6[i].m_backend.fpclass;
      pnVar7[i].m_backend.prec_elem = iVar4;
    }
    break;
  default:
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_3b8.data._M_elems._0_8_ = local_3b8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,"XCHANG04 This should never happen.","");
    *puVar22 = &PTR__SPxException_0069d438;
    puVar22[1] = puVar22 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar22 + 1),local_3b8.data._M_elems._0_8_,
               local_3b8.data._M_elems._0_8_ + local_3b8.data._M_elems._8_8_);
    *puVar22 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2)
    ;
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
    local_128.m_backend.exp = (newRhs->m_backend).exp;
    local_128.m_backend.neg = (newRhs->m_backend).neg;
    local_128.m_backend.fpclass = (newRhs->m_backend).fpclass;
    local_128.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
    local_178.m_backend.data._M_elems[0] = local_368.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = local_368.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = local_368.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = local_368.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = local_368.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = local_368.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = local_368.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = local_368.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = local_368.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = local_368.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = local_368.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = local_368.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = local_368.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = local_368.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = local_368.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = local_368.data._M_elems[0xf];
    local_178.m_backend.exp = iVar17;
    local_178.m_backend.neg = bVar16;
    local_178.m_backend.fpclass = fVar3;
    local_178.m_backend.prec_elem = iVar4;
    RVar8 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar16 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_128,&local_178,RVar8);
    if (bVar16) {
      pSVar5[i] = P_FIXED;
    }
    break;
  case P_ON_UPPER:
    ::soplex::infinity::__tls_init();
    local_2c8 = *(double *)(in_FS_OFFSET + -8);
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 0x10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems[6] = 0;
    local_3b8.data._M_elems[7] = 0;
    local_3b8.data._M_elems[8] = 0;
    local_3b8.data._M_elems[9] = 0;
    local_3b8.data._M_elems[10] = 0;
    local_3b8.data._M_elems[0xb] = 0;
    local_3b8.data._M_elems[0xc] = 0;
    local_3b8.data._M_elems[0xd] = 0;
    local_3b8.data._M_elems._56_5_ = 0;
    local_3b8.data._M_elems[0xf]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    uStack_2c0 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_3b8,local_2c8);
    fVar20 = (newRhs->m_backend).fpclass;
    if ((fVar20 != cpp_dec_float_NaN) && (local_3b8.fpclass != cpp_dec_float_NaN)) {
      iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&newRhs->m_backend,&local_3b8);
      if (-1 < iVar19) {
        ::soplex::infinity::__tls_init();
        local_3b8.fpclass = cpp_dec_float_finite;
        local_3b8.prec_elem = 0x10;
        local_3b8.data._M_elems[0] = 0;
        local_3b8.data._M_elems[1] = 0;
        local_3b8.data._M_elems[2] = 0;
        local_3b8.data._M_elems[3] = 0;
        local_3b8.data._M_elems[4] = 0;
        local_3b8.data._M_elems[5] = 0;
        local_3b8.data._M_elems[6] = 0;
        local_3b8.data._M_elems[7] = 0;
        local_3b8.data._M_elems[8] = 0;
        local_3b8.data._M_elems[9] = 0;
        local_3b8.data._M_elems[10] = 0;
        local_3b8.data._M_elems[0xb] = 0;
        local_3b8.data._M_elems[0xc] = 0;
        local_3b8.data._M_elems[0xd] = 0;
        local_3b8.data._M_elems._56_5_ = 0;
        local_3b8.data._M_elems[0xf]._1_3_ = 0;
        local_3b8.exp = 0;
        local_3b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_3b8,-local_2c8);
        if ((fVar3 != cpp_dec_float_NaN) && (local_3b8.fpclass != cpp_dec_float_NaN)) {
          iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_368,&local_3b8);
          if (iVar17 < 1) {
            pSVar5[i] = P_FREE;
            if ((this->m_nonbasicValueUpToDate == true) && (this->theRep == COLUMN)) {
              pnVar6 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_318.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[i].m_backend.data;
              local_318.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8);
              puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
              local_318.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_318.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x20);
              local_318.data._M_elems._32_8_ = *(undefined8 *)puVar1;
              local_318.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x30);
              local_318.data._M_elems._48_8_ = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_318.data._M_elems._56_5_ = SUB85(uVar9,0);
              local_318.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
              local_318.exp = pnVar6[i].m_backend.exp;
              local_318.neg = pnVar6[i].m_backend.neg;
              local_318.fpclass = pnVar6[i].m_backend.fpclass;
              local_318.prec_elem = pnVar6[i].m_backend.prec_elem;
              if (local_318.data._M_elems[0] != 0 || local_318.fpclass != cpp_dec_float_finite) {
                local_318.neg = (bool)(local_318.neg ^ 1);
              }
              local_3b8.fpclass = cpp_dec_float_finite;
              local_3b8.prec_elem = 0x10;
              local_3b8.data._M_elems[0] = 0;
              local_3b8.data._M_elems[1] = 0;
              local_3b8.data._M_elems[2] = 0;
              local_3b8.data._M_elems[3] = 0;
              local_3b8.data._M_elems[4] = 0;
              local_3b8.data._M_elems[5] = 0;
              local_3b8.data._M_elems[6] = 0;
              local_3b8.data._M_elems[7] = 0;
              local_3b8.data._M_elems[8] = 0;
              local_3b8.data._M_elems[9] = 0;
              local_3b8.data._M_elems[10] = 0;
              local_3b8.data._M_elems[0xb] = 0;
              local_3b8.data._M_elems[0xc] = 0;
              local_3b8.data._M_elems[0xd] = 0;
              local_3b8.data._M_elems._56_5_ = 0;
              local_3b8.data._M_elems[0xf]._1_3_ = 0;
              local_3b8.exp = 0;
              local_3b8.neg = false;
              if (&local_3b8 == &oldRhs->m_backend) {
                oldRhs = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_318;
              }
              else {
                local_3b8.prec_elem = local_318.prec_elem;
                local_3b8.fpclass = local_318.fpclass;
                local_3b8.data._M_elems._0_8_ = local_318.data._M_elems._0_8_;
                local_3b8.data._M_elems._8_8_ = local_318.data._M_elems._8_8_;
                local_3b8.data._M_elems._16_8_ = local_318.data._M_elems._16_8_;
                local_3b8.data._M_elems._24_8_ = local_318.data._M_elems._24_8_;
                local_3b8.data._M_elems._32_8_ = local_318.data._M_elems._32_8_;
                local_3b8.data._M_elems._40_8_ = local_318.data._M_elems._40_8_;
                local_3b8.data._M_elems._48_8_ = local_318.data._M_elems._48_8_;
                local_3b8.data._M_elems._56_5_ = local_318.data._M_elems._56_5_;
                local_3b8.data._M_elems[0xf]._1_3_ = local_318.data._M_elems[0xf]._1_3_;
                local_3b8.exp = local_318.exp;
                local_3b8.neg = local_318.neg;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_3b8,&oldRhs->m_backend);
              local_408 = local_3b8.data._M_elems._0_8_;
              lStack_400 = local_3b8.data._M_elems._8_8_;
              local_3f8._0_8_ = local_3b8.data._M_elems._16_8_;
              local_3f8._8_8_ = local_3b8.data._M_elems._24_8_;
              local_3f8._16_8_ = local_3b8.data._M_elems._32_8_;
              local_3f8._24_8_ = local_3b8.data._M_elems._40_8_;
              local_3f8._32_8_ = local_3b8.data._M_elems._48_8_;
              unique0x100036e6 = local_3b8.data._M_elems._56_5_;
              uStack_3cb = local_3b8.data._M_elems[0xf]._1_3_;
              iStack_3c8 = local_3b8.exp;
              bStack_3c4 = local_3b8.neg;
              local_3c0 = local_3b8._72_8_;
            }
            break;
          }
        }
        pSVar5[i] = P_ON_LOWER;
        if ((this->m_nonbasicValueUpToDate == true) && (this->theRep == COLUMN)) {
          local_318.fpclass = cpp_dec_float_finite;
          local_318.prec_elem = 0x10;
          local_318.data._M_elems[0] = 0;
          local_318.data._M_elems[1] = 0;
          local_318.data._M_elems[2] = 0;
          local_318.data._M_elems[3] = 0;
          local_318.data._M_elems[4] = 0;
          local_318.data._M_elems[5] = 0;
          local_318.data._M_elems[6] = 0;
          local_318.data._M_elems[7] = 0;
          local_318.data._M_elems[8] = 0;
          local_318.data._M_elems[9] = 0;
          local_318.data._M_elems[10] = 0;
          local_318.data._M_elems[0xb] = 0;
          local_318.data._M_elems[0xc] = 0;
          local_318.data._M_elems[0xd] = 0;
          local_318.data._M_elems._56_5_ = 0;
          local_318.data._M_elems[0xf]._1_3_ = 0;
          local_318.exp = 0;
          local_318.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_318,
                     &(this->theURbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_368);
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_88,
                     &(this->theLRbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldRhs->m_backend);
          local_3b8.fpclass = cpp_dec_float_finite;
          local_3b8.prec_elem = 0x10;
          local_3b8.data._M_elems[0] = 0;
          local_3b8.data._M_elems[1] = 0;
          local_3b8.data._M_elems[2] = 0;
          local_3b8.data._M_elems[3] = 0;
          local_3b8.data._M_elems[4] = 0;
          local_3b8.data._M_elems[5] = 0;
          local_3b8.data._M_elems[6] = 0;
          local_3b8.data._M_elems[7] = 0;
          local_3b8.data._M_elems[8] = 0;
          local_3b8.data._M_elems[9] = 0;
          local_3b8.data._M_elems[10] = 0;
          local_3b8.data._M_elems[0xb] = 0;
          local_3b8.data._M_elems[0xc] = 0;
          local_3b8.data._M_elems[0xd] = 0;
          local_3b8.data._M_elems._56_5_ = 0;
          local_3b8.data._M_elems[0xf]._1_3_ = 0;
          local_3b8.exp = 0;
          local_3b8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_3b8,&local_318,&local_88);
          local_408 = local_3b8.data._M_elems._0_8_;
          lStack_400 = local_3b8.data._M_elems._8_8_;
          local_3f8._0_8_ = local_3b8.data._M_elems._16_8_;
          local_3f8._8_8_ = local_3b8.data._M_elems._24_8_;
          local_3f8._16_8_ = local_3b8.data._M_elems._32_8_;
          local_3f8._24_8_ = local_3b8.data._M_elems._40_8_;
          local_3f8._32_8_ = local_3b8.data._M_elems._48_8_;
          unique0x100036eb = local_3b8.data._M_elems._56_5_;
          uStack_3cb = local_3b8.data._M_elems[0xf]._1_3_;
          iStack_3c8 = local_3b8.exp;
          bStack_3c4 = local_3b8.neg;
          local_3c0 = local_3b8._72_8_;
        }
        break;
      }
      fVar20 = (newRhs->m_backend).fpclass;
    }
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
    local_2b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2)
    ;
    local_2b8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
    local_2b8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
    local_2b8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
    local_2b8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
    local_2b8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
    local_2b8.m_backend.exp = (newRhs->m_backend).exp;
    local_2b8.m_backend.neg = (newRhs->m_backend).neg;
    local_2b8.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
    local_d8.m_backend.data._M_elems[0] = local_368.data._M_elems[0];
    local_d8.m_backend.data._M_elems[1] = local_368.data._M_elems[1];
    local_d8.m_backend.data._M_elems[2] = local_368.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = local_368.data._M_elems[3];
    local_d8.m_backend.data._M_elems[4] = local_368.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = local_368.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = local_368.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = local_368.data._M_elems[7];
    local_d8.m_backend.data._M_elems[8] = local_368.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = local_368.data._M_elems[9];
    local_d8.m_backend.data._M_elems[10] = local_368.data._M_elems[10];
    local_d8.m_backend.data._M_elems[0xb] = local_368.data._M_elems[0xb];
    local_d8.m_backend.data._M_elems[0xc] = local_368.data._M_elems[0xc];
    local_d8.m_backend.data._M_elems[0xd] = local_368.data._M_elems[0xd];
    local_d8.m_backend.data._M_elems[0xe] = local_368.data._M_elems[0xe];
    local_d8.m_backend.data._M_elems[0xf] = local_368.data._M_elems[0xf];
    local_2b8.m_backend.fpclass = fVar20;
    local_d8.m_backend.exp = iVar17;
    local_d8.m_backend.neg = bVar16;
    local_d8.m_backend.fpclass = fVar3;
    local_d8.m_backend.prec_elem = iVar4;
    RVar8 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar16 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_2b8,&local_d8,RVar8);
    if (bVar16) {
      pSVar5[i] = P_FIXED;
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar6 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar6 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_318.fpclass = cpp_dec_float_finite;
    local_318.prec_elem = 0x10;
    local_318.data._M_elems[0] = 0;
    local_318.data._M_elems[1] = 0;
    local_318.data._M_elems[2] = 0;
    local_318.data._M_elems[3] = 0;
    local_318.data._M_elems[4] = 0;
    local_318.data._M_elems[5] = 0;
    local_318.data._M_elems[6] = 0;
    local_318.data._M_elems[7] = 0;
    local_318.data._M_elems[8] = 0;
    local_318.data._M_elems[9] = 0;
    local_318.data._M_elems[10] = 0;
    local_318.data._M_elems[0xb] = 0;
    local_318.data._M_elems[0xc] = 0;
    local_318.data._M_elems[0xd] = 0;
    local_318.data._M_elems._56_5_ = 0;
    local_318.data._M_elems[0xf]._1_3_ = 0;
    local_318.exp = 0;
    local_318.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_318,&newRhs->m_backend,&oldRhs->m_backend);
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 0x10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems[6] = 0;
    local_3b8.data._M_elems[7] = 0;
    local_3b8.data._M_elems[8] = 0;
    local_3b8.data._M_elems[9] = 0;
    local_3b8.data._M_elems[10] = 0;
    local_3b8.data._M_elems[0xb] = 0;
    local_3b8.data._M_elems[0xc] = 0;
    local_3b8.data._M_elems[0xd] = 0;
    local_3b8.data._M_elems._56_5_ = 0;
    local_3b8.data._M_elems[0xf]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_3b8,&pnVar6[i].m_backend,&local_318);
    local_408 = local_3b8.data._M_elems._0_8_;
    lStack_400 = local_3b8.data._M_elems._8_8_;
    local_3f8._0_8_ = local_3b8.data._M_elems._16_8_;
    local_3f8._8_8_ = local_3b8.data._M_elems._24_8_;
    local_3f8._16_8_ = local_3b8.data._M_elems._32_8_;
    local_3f8._24_8_ = local_3b8.data._M_elems._40_8_;
    local_3f8._32_8_ = local_3b8.data._M_elems._48_8_;
    unique0x100036f0 = local_3b8.data._M_elems._56_5_;
    uStack_3cb = local_3b8.data._M_elems[0xf]._1_3_;
    iStack_3c8 = local_3b8.exp;
    bStack_3c4 = local_3b8.neg;
    local_3c0 = local_3b8._72_8_;
    break;
  case P_FREE:
    ::soplex::infinity::__tls_init();
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 0x10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems[6] = 0;
    local_3b8.data._M_elems[7] = 0;
    local_3b8.data._M_elems[8] = 0;
    local_3b8.data._M_elems[9] = 0;
    local_3b8.data._M_elems[10] = 0;
    local_3b8.data._M_elems[0xb] = 0;
    local_3b8.data._M_elems[0xc] = 0;
    local_3b8.data._M_elems[0xd] = 0;
    local_3b8.data._M_elems._56_5_ = 0;
    local_3b8.data._M_elems[0xf]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_3b8,*(double *)(in_FS_OFFSET + -8));
    if (((((newRhs->m_backend).fpclass != cpp_dec_float_NaN) &&
         (local_3b8.fpclass != cpp_dec_float_NaN)) &&
        (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&newRhs->m_backend,&local_3b8), iVar17 < 0)) &&
       ((pSVar5[i] = P_ON_UPPER, this->m_nonbasicValueUpToDate == true && (this->theRep == COLUMN)))
       ) {
      local_3b8.fpclass = cpp_dec_float_finite;
      local_3b8.prec_elem = 0x10;
      local_3b8.data._M_elems[0] = 0;
      local_3b8.data._M_elems[1] = 0;
      local_3b8.data._M_elems[2] = 0;
      local_3b8.data._M_elems[3] = 0;
      local_3b8.data._M_elems[4] = 0;
      local_3b8.data._M_elems[5] = 0;
      local_3b8.data._M_elems[6] = 0;
      local_3b8.data._M_elems[7] = 0;
      local_3b8.data._M_elems[8] = 0;
      local_3b8.data._M_elems[9] = 0;
      local_3b8.data._M_elems[10] = 0;
      local_3b8.data._M_elems[0xb] = 0;
      local_3b8.data._M_elems[0xc] = 0;
      local_3b8.data._M_elems[0xd] = 0;
      local_3b8.data._M_elems._56_5_ = 0;
      local_3b8.data._M_elems[0xf]._1_3_ = 0;
      local_3b8.exp = 0;
      local_3b8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_3b8,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newRhs->m_backend);
      local_408 = local_3b8.data._M_elems._0_8_;
      lStack_400 = local_3b8.data._M_elems._8_8_;
      local_3f8._0_8_ = local_3b8.data._M_elems._16_8_;
      local_3f8._8_8_ = local_3b8.data._M_elems._24_8_;
      local_3f8._16_8_ = local_3b8.data._M_elems._32_8_;
      local_3f8._24_8_ = local_3b8.data._M_elems._40_8_;
      local_3f8._32_8_ = local_3b8.data._M_elems._48_8_;
      unique0x100036e1 = local_3b8.data._M_elems._56_5_;
      uStack_3cb = local_3b8.data._M_elems[0xf]._1_3_;
      iStack_3c8 = local_3b8.exp;
      bStack_3c4 = local_3b8.neg;
      local_3c0 = local_3b8._72_8_;
    }
  }
  if (this->theRep == COLUMN) {
    local_268.m_backend.data._M_elems[0xf]._1_3_ = uStack_3cb;
    local_268.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffc30;
    local_268.m_backend.data._M_elems[0xc] = local_3f8[8];
    local_268.m_backend.data._M_elems[0xd] = local_3f8[9];
    local_268.m_backend.data._M_elems[8] = local_3f8[4];
    local_268.m_backend.data._M_elems[9] = local_3f8[5];
    local_268.m_backend.data._M_elems[10] = local_3f8[6];
    local_268.m_backend.data._M_elems[0xb] = local_3f8[7];
    local_268.m_backend.data._M_elems[4] = local_3f8[0];
    local_268.m_backend.data._M_elems[5] = local_3f8[1];
    local_268.m_backend.data._M_elems[6] = local_3f8[2];
    local_268.m_backend.data._M_elems[7] = local_3f8[3];
    local_268.m_backend.data._M_elems[0] = (uint)local_408;
    local_268.m_backend.data._M_elems[1] = local_408._4_4_;
    local_268.m_backend.data._M_elems[2] = (undefined4)lStack_400;
    local_268.m_backend.data._M_elems[3] = lStack_400._4_4_;
    local_268.m_backend.exp = iStack_3c8;
    local_268.m_backend.neg = (bool)bStack_3c4;
    local_268.m_backend.fpclass = (fpclass_type)local_3c0;
    local_268.m_backend.prec_elem = local_3c0._4_4_;
    updateNonbasicValue(this,&local_268);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRhsStatus(int i, R newRhs, R oldRhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currLhs   = this->lhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG04 changeRhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(newRhs >= R(infinity))
      {
         if(currLhs <= R(-infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theLRbound[i] * oldRhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theURbound[i] * currLhs) - (theLRbound[i] * oldRhs);
         }
      }
      else if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newRhs - oldRhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theLRbound[i] * (newRhs - oldRhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newRhs < R(infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theLRbound[i] * newRhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(isInitialized())
            theURbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG04 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}